

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ovf.cpp
# Opt level: O3

int ovf_write_segment_8(ovf_file *ovf_file_ptr,ovf_segment *segment,double *data,int format)

{
  int iVar1;
  char *pcVar2;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  undefined1 *local_278 [2];
  undefined1 local_268 [16];
  ulong local_258 [3];
  undefined **local_240;
  undefined1 *local_238;
  long local_230;
  undefined8 local_228;
  undefined1 local_220 [504];
  
  if (ovf_file_ptr != (ovf_file *)0x0) {
    if (segment == (ovf_segment *)0x0) {
      pcVar2 = "libovf ovf_write_segment_8: invalid segment pointer";
    }
    else {
      pcVar2 = "libovf ovf_write_segment_8: segment not correctly initialized";
      if ((segment->title != (char *)0x0) && (segment->comment != (char *)0x0)) {
        if (data != (double *)0x0) {
          iVar1 = 0;
          if ((format - 1U < 2) ||
             (((uint)format < 5 && (iVar1 = format, (0x19U >> (format & 0x1fU) & 1) != 0)))) {
            iVar1 = ovf::detail::write::segment<double>(ovf_file_ptr,segment,data,false,iVar1);
            if (iVar1 != -1) {
              std::__cxx11::string::append((char *)&ovf_file_ptr->_state->message_latest);
              return iVar1;
            }
            return -1;
          }
          local_258[0] = (ulong)(uint)format;
          local_230 = 0;
          local_240 = &PTR_grow_00178c20;
          local_228 = 500;
          format_str.size_ = 0x32;
          format_str.data_ = "libovf ovf_write_segment_8: invalid format \'{}\'...";
          args.field_1.values_ =
               (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                *)local_258;
          args.types_ = fmt::v5::
                        format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
                        ::TYPES;
          local_238 = local_220;
          fmt::v5::
          vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                    ((range)&local_240,format_str,args);
          local_278[0] = local_268;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_278,local_238,local_238 + local_230);
          local_240 = &PTR_grow_00178c20;
          if (local_238 != local_220) {
            operator_delete(local_238);
          }
          std::__cxx11::string::operator=
                    ((string *)&ovf_file_ptr->_state->message_latest,(string *)local_278);
          if (local_278[0] == local_268) {
            return -2;
          }
          operator_delete(local_278[0]);
          return -2;
        }
        pcVar2 = "libovf ovf_write_segment_8: invalid data pointer";
      }
    }
    std::__cxx11::string::_M_replace
              ((ulong)&ovf_file_ptr->_state->message_latest,0,
               (char *)(ovf_file_ptr->_state->message_latest)._M_string_length,(ulong)pcVar2);
  }
  return -2;
}

Assistant:

int ovf_write_segment_8(struct ovf_file *ovf_file_ptr, const struct ovf_segment *segment, double *data, int format)
try
{
    if( !ovf_file_ptr )
        return OVF_ERROR;

    if( !segment )
    {
        ovf_file_ptr->_state->message_latest =
            "libovf ovf_write_segment_8: invalid segment pointer";
        return OVF_ERROR;
    }

    if( !check_segment(segment) )
    {
        ovf_file_ptr->_state->message_latest =
            "libovf ovf_write_segment_8: segment not correctly initialized";
        return OVF_ERROR;
    }

    if( !data )
    {
        ovf_file_ptr->_state->message_latest =
            "libovf ovf_write_segment_8: invalid data pointer";
        return OVF_ERROR;
    }

    if( format == OVF_FORMAT_BIN8 ||
        format == OVF_FORMAT_BIN4 )
        format = OVF_FORMAT_BIN;

    if( format != OVF_FORMAT_BIN  &&
        format != OVF_FORMAT_TEXT &&
        format != OVF_FORMAT_CSV  )
    {
        ovf_file_ptr->_state->message_latest =
            fmt::format("libovf ovf_write_segment_8: invalid format \'{}\'...", format);
        return OVF_ERROR;
    }

    int retcode = ovf::detail::write::segment(ovf_file_ptr, segment, data, false, format);
    if (retcode != OVF_OK)
        ovf_file_ptr->_state->message_latest += "\novf_write_segment_8 failed.";
    return retcode;
}
catch( ... )
{
    return OVF_ERROR;
}